

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp
# Opt level: O0

IterateResult __thiscall
glcts::MultisampleTextureTexStorage2DUnsupportedSamplesCountForDepthTexturesTest::iterate
          (MultisampleTextureTexStorage2DUnsupportedSamplesCountForDepthTexturesTest *this)

{
  undefined1 uVar1;
  GLenum GVar2;
  int iVar3;
  deUint32 dVar4;
  deBool dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  TestError *this_00;
  int local_54;
  GLboolean fixedsamplelocations;
  int fixedsamplelocations_index;
  GLenum internalformat;
  int internalformat_index;
  GLsizei width;
  GLenum target;
  int internalformat_list_count;
  GLenum internalformat_list [3];
  GLsizei height;
  GLint gl_max_samples_value;
  GLint gl_max_internalformat_samples_value;
  GLint gl_max_depth_texture_samples_value;
  Functions *gl;
  int fixedsamplelocations_list_count;
  GLboolean fixedsamplelocations_list [2];
  MultisampleTextureTexStorage2DUnsupportedSamplesCountForDepthTexturesTest *this_local;
  
  gl._6_2_ = 0x100;
  gl._0_4_ = 2;
  _fixedsamplelocations_list_count = this;
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar6->_vptr_RenderContext[3])();
  _gl_max_internalformat_samples_value = CONCAT44(extraout_var,iVar3);
  gl_max_samples_value = -1;
  height = -1;
  internalformat_list[2] = 0xffffffff;
  internalformat_list[1] = 1;
  _target = 0x8cac000081a5;
  internalformat_list[0] = 0x88f0;
  fixedsamplelocations_index = 0;
  do {
    if (2 < fixedsamplelocations_index) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      return STOP;
    }
    GVar2 = (&target)[fixedsamplelocations_index];
    for (local_54 = 0; local_54 < 2; local_54 = local_54 + 1) {
      uVar1 = *(undefined1 *)((long)&gl + (long)local_54 + 6);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])();
      (**(code **)(_gl_max_internalformat_samples_value + 0x868))(0x8d57,internalformat_list + 2);
      dVar4 = (**(code **)(_gl_max_internalformat_samples_value + 0x800))();
      glu::checkError(dVar4,"Failed to retrieve GL_MAX_SAMPLES value",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                      ,0x3c4);
      (**(code **)(_gl_max_internalformat_samples_value + 0x868))(0x910f,&gl_max_samples_value);
      dVar4 = (**(code **)(_gl_max_internalformat_samples_value + 0x800))();
      glu::checkError(dVar4,"Failed to retrieve GL_MAX_DEPTH_TEXTURE_SAMPLES value",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                      ,0x3c9);
      (**(code **)(_gl_max_internalformat_samples_value + 0x880))(0x9100,GVar2,0x80a9,1,&height);
      dVar4 = (**(code **)(_gl_max_internalformat_samples_value + 0x800))();
      glu::checkError(dVar4,"glGetInternalformativ() failed to retrieve GL_SAMPLES",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                      ,0x3ce);
      (**(code **)(_gl_max_internalformat_samples_value + 0x1390))
                (0x9100,height + 1,GVar2,1,1,uVar1);
      do {
        dVar5 = ::deGetFalse();
        if (dVar5 != 0) {
LAB_013f2dfc:
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,
                     "glTexStorage2DMultisample() did not generate GL_INVALID_OPERATION error.",
                     "gl.getError() == GL_INVALID_OPERATION",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                     ,0x3d6);
          __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        iVar3 = (**(code **)(_gl_max_internalformat_samples_value + 0x800))();
        if (iVar3 != 0x502) goto LAB_013f2dfc;
        dVar5 = ::deGetFalse();
      } while (dVar5 != 0);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])();
    }
    fixedsamplelocations_index = fixedsamplelocations_index + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult MultisampleTextureTexStorage2DUnsupportedSamplesCountForDepthTexturesTest::iterate()
{
	/* Test case variables */
	const glw::GLboolean fixedsamplelocations_list[] = { GL_FALSE, GL_TRUE };
	const int			 fixedsamplelocations_list_count =
		sizeof(fixedsamplelocations_list) / sizeof(fixedsamplelocations_list[0]);
	const glw::Functions& gl								  = m_context.getRenderContext().getFunctions();
	glw::GLint			  gl_max_depth_texture_samples_value  = -1; /* Will be determined later */
	glw::GLint			  gl_max_internalformat_samples_value = -1; /* Will be determined later */
	glw::GLint			  gl_max_samples_value				  = -1; /* Will be determined later */
	const glw::GLsizei	height							  = 1;
	const glw::GLenum	 internalformat_list[] = { GL_DEPTH_COMPONENT16, GL_DEPTH_COMPONENT32F, GL_DEPTH24_STENCIL8 };
	const int			  internalformat_list_count = sizeof(internalformat_list) / sizeof(internalformat_list[0]);
	const glw::GLenum	 target = GL_TEXTURE_2D_MULTISAMPLE; /* Test case uses GL_TEXTURE_2D_MULTISAMPLE target */
	const glw::GLsizei	width  = 1;

	/* Iterate through all internal formats test case should check */
	for (int internalformat_index = 0; internalformat_index < internalformat_list_count; internalformat_index++)
	{
		/* Iteration-specific internalformat */
		glw::GLenum internalformat = internalformat_list[internalformat_index];

		/* Iterate through all fixedsamplelocations test case should check */
		for (int fixedsamplelocations_index = 0; fixedsamplelocations_index < fixedsamplelocations_list_count;
			 fixedsamplelocations_index++)
		{
			/* Iteration-specific fixedsamplelocations */
			glw::GLboolean fixedsamplelocations = fixedsamplelocations_list[fixedsamplelocations_index];

			/* Initialize texture object and bind it to GL_TEXTURE_2D_MULTISAMPLE target */
			initInternalIteration();

			/* Get GL_MAX_SAMPLES value */
			gl.getIntegerv(GL_MAX_SAMPLES, &gl_max_samples_value);

			GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to retrieve GL_MAX_SAMPLES value");

			/* Get GL_MAX_DEPTH_TEXTURE_SAMPLES value */
			gl.getIntegerv(GL_MAX_DEPTH_TEXTURE_SAMPLES, &gl_max_depth_texture_samples_value);

			GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to retrieve GL_MAX_DEPTH_TEXTURE_SAMPLES value");

			/* Retrieve maximum amount of samples available for the texture target considered */
			gl.getInternalformativ(target, internalformat, GL_SAMPLES, 1, &gl_max_internalformat_samples_value);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetInternalformativ() failed to retrieve GL_SAMPLES");

			/* Issue call with valid parameters, but samples argument might be invalid */
			gl.texStorage2DMultisample(target, gl_max_internalformat_samples_value + 1, internalformat, width, height,
									   fixedsamplelocations);

			/* Expect GL_INVALID_OPERATION error code. */
			TCU_CHECK_MSG(gl.getError() == GL_INVALID_OPERATION,
						  "glTexStorage2DMultisample() did not generate GL_INVALID_OPERATION error.");

			/* Deinitialize texture object and unbind texture object bound to GL_TEXTURE_2D_MULTISAMPLE target */
			deinitInternalIteration();
		}
	}

	/* Test case passed */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}